

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITTypeHandler.cpp
# Opt level: O1

bool JITTypeHandler::IsTypeHandlerCompatibleForObjectHeaderInlining
               (JITTypeHandler *oldTypeHandler,JITTypeHandler *newTypeHandler)

{
  ushort uVar1;
  ushort uVar2;
  code *pcVar3;
  bool bVar4;
  PropertyIndex PVar5;
  undefined4 *puVar6;
  
  if (oldTypeHandler == (JITTypeHandler *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTypeHandler.cpp"
                       ,0x36,"(oldTypeHandler)","oldTypeHandler");
    if (!bVar4) goto LAB_0057692f;
    *puVar6 = 0;
  }
  if (newTypeHandler == (JITTypeHandler *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTypeHandler.cpp"
                       ,0x37,"(newTypeHandler)","newTypeHandler");
    if (!bVar4) {
LAB_0057692f:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  uVar1 = (oldTypeHandler->m_data).inlineSlotCapacity;
  uVar2 = (newTypeHandler->m_data).inlineSlotCapacity;
  bVar4 = true;
  if (uVar1 != uVar2) {
    if ((oldTypeHandler->m_data).isObjectHeaderInlinedTypeHandler == '\0') {
      bVar4 = false;
    }
    else {
      PVar5 = Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity();
      bVar4 = (uint)uVar1 - (uint)PVar5 == (uint)uVar2;
    }
  }
  return bVar4;
}

Assistant:

bool
JITTypeHandler::IsTypeHandlerCompatibleForObjectHeaderInlining(const JITTypeHandler * oldTypeHandler, const JITTypeHandler * newTypeHandler)
{
    Assert(oldTypeHandler);
    Assert(newTypeHandler);

    return
        oldTypeHandler->GetInlineSlotCapacity() == newTypeHandler->GetInlineSlotCapacity() ||
        (
            oldTypeHandler->IsObjectHeaderInlinedTypeHandler() &&
            newTypeHandler->GetInlineSlotCapacity() ==
            oldTypeHandler->GetInlineSlotCapacity() - Js::DynamicTypeHandler::GetObjectHeaderInlinableSlotCapacity()
        );
}